

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O2

bool __thiscall libcalc::Token::push(Token *this,char symbol)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  
  bVar2 = symbolType(symbol);
  if (bVar2 == 3) {
LAB_001038f2:
    bVar3 = false;
  }
  else {
    cVar1 = this->type;
    if (cVar1 == '\x02' && (bVar2 ^ 2) == 0) {
LAB_00103909:
      std::__cxx11::string::push_back((char)this);
    }
    else {
      if (cVar1 != '\0') {
        if ((bVar2 ^ 2) == 0 && cVar1 == '\x01') {
          bVar3 = std::operator==(&this->value,"-");
          if (bVar3) {
            this->type = '\x02';
            goto LAB_00103909;
          }
        }
        goto LAB_001038f2;
      }
      this->type = bVar2;
      std::__cxx11::string::operator=((string *)this,symbol);
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Token::push(const char symbol) {
  char st = symbolType(symbol);

  if (st == TOKEN_TYPE.GARBAGE) {
    return false;
  }

  if (type == TOKEN_TYPE.SYMBOL && st == type) {
    value += symbol;
    return true;
  }

  if (type == TOKEN_TYPE.EMPTY) {
    type = st;
    value = symbol;
    return true;
  }

  if (type == TOKEN_TYPE.OPERATOR &&
      st == TOKEN_TYPE.SYMBOL     &&
      value == "-" ) {
    type = st;
    value += symbol;
    return true;
  }

  return false;
}